

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_cx_iface.c
# Opt level: O3

aom_codec_err_t
ctrl_set_number_spatial_layers(aom_codec_alg_priv_t_conflict *ctx,__va_list_tag *args)

{
  AV1EncoderConfig *oxcf;
  uint uVar1;
  AV1_COMP *pAVar2;
  aom_internal_error_info *paVar3;
  int iVar4;
  uint *puVar5;
  AV1_PRIMARY *pAVar6;
  long lVar7;
  undefined8 uStack_38;
  
  uVar1 = args->gp_offset;
  if ((ulong)uVar1 < 0x29) {
    puVar5 = (uint *)((ulong)uVar1 + (long)args->reg_save_area);
    args->gp_offset = uVar1 + 8;
  }
  else {
    puVar5 = (uint *)args->overflow_arg_area;
    args->overflow_arg_area = puVar5 + 2;
  }
  if ((int)*puVar5 < 5) {
    pAVar6 = ctx->ppi;
    pAVar6->number_spatial_layers = *puVar5;
    if (pAVar6->seq_params_locked != 0) {
      return AOM_CODEC_OK;
    }
    uStack_38 = 0;
    oxcf = &ctx->oxcf;
    set_encoder_config(oxcf,&ctx->cfg,&ctx->extra_cfg);
    av1_check_fpmt_config(ctx->ppi,oxcf);
    uStack_38 = uStack_38 & 0xffffffffffffff;
    av1_change_config_seq(ctx->ppi,oxcf,(_Bool *)((long)&uStack_38 + 7));
    pAVar6 = ctx->ppi;
    if (0 < pAVar6->num_fp_contexts) {
      lVar7 = 0;
      do {
        pAVar2 = pAVar6->parallel_cpi[lVar7];
        paVar3 = (pAVar2->common).error;
        iVar4 = _setjmp((__jmp_buf_tag *)paVar3->jmp);
        if (iVar4 != 0) {
          paVar3->setjmp = 0;
          return paVar3->error_code;
        }
        paVar3->setjmp = 1;
        av1_change_config(pAVar2,oxcf,uStack_38._7_1_);
        paVar3->setjmp = 0;
        lVar7 = lVar7 + 1;
        pAVar6 = ctx->ppi;
      } while (lVar7 < pAVar6->num_fp_contexts);
    }
    pAVar2 = pAVar6->cpi_lap;
    if (pAVar2 != (AV1_COMP *)0x0) {
      paVar3 = (pAVar2->common).error;
      iVar4 = _setjmp((__jmp_buf_tag *)paVar3->jmp);
      if (iVar4 != 0) {
        paVar3->setjmp = 0;
        return paVar3->error_code;
      }
      paVar3->setjmp = 1;
      av1_change_config(pAVar2,oxcf,uStack_38._7_1_);
      paVar3->setjmp = 0;
    }
    return AOM_CODEC_OK;
  }
  return AOM_CODEC_INVALID_PARAM;
}

Assistant:

static aom_codec_err_t ctrl_set_number_spatial_layers(aom_codec_alg_priv_t *ctx,
                                                      va_list args) {
  const int number_spatial_layers = va_arg(args, int);
  if (number_spatial_layers > MAX_NUM_SPATIAL_LAYERS)
    return AOM_CODEC_INVALID_PARAM;
  ctx->ppi->number_spatial_layers = number_spatial_layers;
  // update_encoder_cfg() is somewhat costly and this control may be called
  // multiple times, so update_encoder_cfg() is only called to ensure frame and
  // superblock sizes are updated before they're fixed by the first encode
  // call.
  if (!ctx->ppi->seq_params_locked) {
    return update_encoder_cfg(ctx);
  }
  return AOM_CODEC_OK;
}